

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O1

void glmc_euler_zxy(float *angles,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = sinf(*angles);
  fVar2 = cosf(*angles);
  fVar3 = sinf(angles[1]);
  fVar4 = cosf(angles[1]);
  fVar5 = sinf(angles[2]);
  fVar6 = cosf(angles[2]);
  (*dest)[0] = fVar4 * fVar6 - fVar1 * fVar3 * fVar5;
  (*dest)[1] = fVar6 * fVar1 * fVar3 + fVar4 * fVar5;
  (*dest)[2] = fVar3 * -fVar2;
  *(ulong *)dest[1] = CONCAT44(fVar6 * fVar2,-fVar2 * fVar5);
  dest[1][2] = fVar1;
  *(ulong *)dest[2] =
       CONCAT44(fVar1 * -(fVar4 * fVar6) + fVar3 * fVar5,fVar3 * fVar6 + fVar1 * fVar4 * fVar5);
  dest[2][2] = fVar2 * fVar4;
  (*dest)[3] = 0.0;
  dest[1][3] = 0.0;
  *(undefined8 *)(dest[2] + 3) = 0;
  *(float *)((long)(dest + 3) + 4) = 0.0;
  *(float *)((long)(dest + 3) + 8) = 0.0;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_zxy(vec3 angles, mat4 dest) {
  glm_euler_zxy(angles, dest);
}